

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
RunScriptCore(char *script,JsSourceContext sourceContext,char *sourceUrl,bool parseOnly,
             JsParseScriptAttributes parseAttributes,bool isSourceModule,JsValueRef *result)

{
  JsErrorCode JVar1;
  size_t cb;
  undefined1 local_60 [8];
  NarrowToWide url;
  
  url._24_8_ = sourceUrl;
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
  NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                       *)local_60,(char **)&url.freeDst,0xffffffffffffffff);
  if (local_60 == (undefined1  [8])0x0) {
    JVar1 = JsErrorOutOfMemory;
  }
  else {
    cb = strlen(script);
    JVar1 = RunScriptCore((JsValueRef)0x0,(byte *)script,cb,LoadScriptFlag_Utf8Source,sourceContext,
                          (WCHAR *)local_60,parseOnly,parseAttributes,isSourceModule,result);
  }
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
  ~NarrowWideConverter
            ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int> *)
             local_60);
  return JVar1;
}

Assistant:

JsErrorCode RunScriptCore(const char *script, JsSourceContext sourceContext,
    const char *sourceUrl, bool parseOnly, JsParseScriptAttributes parseAttributes,
    bool isSourceModule, JsValueRef *result)
{
    utf8::NarrowToWide url((LPCSTR)sourceUrl);
    if (!url)
    {
        return JsErrorOutOfMemory;
    }

    return RunScriptCore(nullptr, reinterpret_cast<const byte*>(script), strlen(script),
        LoadScriptFlag_Utf8Source, sourceContext, url, parseOnly, parseAttributes,
        isSourceModule, result);
}